

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_new_attr2(lyd_node *parent,char *module_ns,char *name,char *value,lyd_attr **attr)

{
  ly_ctx *ctx;
  LY_ERR LVar1;
  char *pcVar2;
  size_t value_len;
  char *pcVar3;
  char *name_local;
  size_t pref_len;
  char *prefix;
  size_t local_68;
  size_t local_60;
  size_t name_len;
  lyd_attr *ret;
  char *local_48;
  size_t local_40;
  char *tmp;
  
  ret = (lyd_attr *)0x0;
  name_local = name;
  if (parent == (lyd_node *)0x0) {
    pcVar3 = "parent";
  }
  else if (parent->schema == (lysc_node *)0x0) {
    if (name != (char *)0x0) {
      ctx = (ly_ctx *)parent[2].schema;
      tmp = name;
      LVar1 = ly_parse_nodeid(&tmp,&prefix,&pref_len,&name_local,&name_len);
      if ((LVar1 != LY_SUCCESS) || (*tmp != '\0')) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Attribute name \"%s\" is not valid.",name_local);
        return LY_EVALID;
      }
      local_60 = pref_len;
      if ((((pref_len == 3) && (local_60 = 3, *prefix == 'x')) && (prefix[1] == 'm')) &&
         (prefix[2] == 'l')) {
        name_len = name_len + 4;
        name_local = prefix;
        prefix = (char *)0x0;
        pref_len = 0;
        local_60 = 0;
      }
      pcVar3 = "";
      if (value != (char *)0x0) {
        pcVar3 = value;
      }
      pcVar2 = strchr(pcVar3,0x3a);
      if (pcVar2 != (char *)0x0) {
        ly_log(ctx,LY_LLWRN,LY_SUCCESS,
               "Value \"%s\" prefix will never be interpreted as an XML prefix.",pcVar3);
        local_60 = pref_len;
      }
      pcVar2 = name_local;
      local_40 = name_len;
      local_48 = prefix;
      if (module_ns == (char *)0x0) {
        local_68 = 0;
      }
      else {
        local_68 = strlen(module_ns);
      }
      value_len = strlen(pcVar3);
      LVar1 = lyd_create_attr(parent,&ret,ctx,pcVar2,local_40,local_48,local_60,module_ns,local_68,
                              pcVar3,value_len,(ly_bool *)0x0,LY_VALUE_XML,(void *)0x0,0x3f3);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (attr == (lyd_attr **)0x0) {
        return LY_SUCCESS;
      }
      *attr = ret;
      return LY_SUCCESS;
    }
    pcVar3 = "name";
  }
  else {
    pcVar3 = "!parent->schema";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"lyd_new_attr2");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_attr2(struct lyd_node *parent, const char *module_ns, const char *name, const char *value,
        struct lyd_attr **attr)
{
    struct lyd_attr *ret = NULL;
    const struct ly_ctx *ctx;
    const char *prefix, *tmp;
    size_t pref_len, name_len;

    LY_CHECK_ARG_RET(NULL, parent, !parent->schema, name, LY_EINVAL);

    ctx = LYD_CTX(parent);

    /* parse the name */
    tmp = name;
    if (ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len) || tmp[0]) {
        LOGERR(ctx, LY_EINVAL, "Attribute name \"%s\" is not valid.", name);
        return LY_EVALID;
    }

    if ((pref_len == 3) && !strncmp(prefix, "xml", 3)) {
        /* not a prefix but special name */
        name = prefix;
        name_len += 1 + pref_len;
        prefix = NULL;
        pref_len = 0;
    }

    /* set value if none */
    if (!value) {
        value = "";
    }
    if (strchr(value, ':')) {
        LOGWRN(ctx, "Value \"%s\" prefix will never be interpreted as an XML prefix.", value);
    }

    LY_CHECK_RET(lyd_create_attr(parent, &ret, ctx, name, name_len, prefix, pref_len, module_ns,
            module_ns ? strlen(module_ns) : 0, value, strlen(value), NULL, LY_VALUE_XML, NULL, LYD_HINT_DATA));

    if (attr) {
        *attr = ret;
    }
    return LY_SUCCESS;
}